

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
* utils::cfg_parsing(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *__return_storage_ptr__,string *cfg_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  istream *piVar6;
  int *piVar7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  long lVar10;
  string x_value2;
  string x_value1;
  string value;
  string line;
  string key;
  istringstream valuestream;
  istringstream linestream;
  ifstream filestream;
  key_type local_5f8;
  char *local_5d8;
  undefined8 local_5d0;
  char local_5c8;
  undefined7 uStack_5c7;
  char *local_5b8;
  undefined8 local_5b0;
  char local_5a8;
  undefined7 uStack_5a7;
  char *local_598;
  long local_590;
  char local_588;
  undefined7 uStack_587;
  undefined1 *local_578;
  long local_570;
  undefined1 local_568;
  undefined7 uStack_567;
  key_type local_558;
  char *local_538 [15];
  ios_base local_4c0 [264];
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [65];
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_578 = &local_568;
  local_570 = 0;
  local_568 = 0;
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  local_558._M_string_length = 0;
  local_558.field_2._M_local_buf[0] = '\0';
  local_598 = &local_588;
  local_590 = 0;
  local_588 = '\0';
  std::ifstream::ifstream(local_238,(string *)cfg_filename,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    paVar1 = &local_5f8.field_2;
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_578,cVar4);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      if (local_570 != 0) {
        lVar10 = 0;
        do {
          if (local_578[lVar10] == '=') {
            local_578[lVar10] = 0x20;
          }
          lVar10 = lVar10 + 1;
        } while (local_570 != lVar10);
      }
      std::__cxx11::istringstream::istringstream(local_3b8,(string *)&local_578,_S_in);
      while( true ) {
        piVar6 = std::operator>>((istream *)local_3b8,(string *)&local_558);
        piVar6 = std::operator>>(piVar6,(string *)&local_598);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
        iVar5 = std::__cxx11::string::compare((char *)&local_558);
        pcVar3 = local_598;
        if (iVar5 == 0) {
          if (local_590 != 0) {
            lVar10 = 0;
            do {
              if (local_598[lVar10] == ',') {
                local_598[lVar10] = ' ';
              }
              lVar10 = lVar10 + 1;
            } while (local_590 != lVar10);
          }
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_538,(string *)&local_598,_S_in);
          local_5b8 = &local_5a8;
          local_5b0 = 0;
          local_5a8 = '\0';
          local_5d8 = &local_5c8;
          local_5d0 = 0;
          local_5c8 = '\0';
          while( true ) {
            piVar6 = std::operator>>((istream *)local_538,(string *)&local_5b8);
            piVar6 = std::operator>>(piVar6,(string *)&local_5d8);
            pcVar3 = local_5b8;
            if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
            piVar7 = __errno_location();
            iVar5 = *piVar7;
            *piVar7 = 0;
            dVar2 = strtod(pcVar3,(char **)&local_5f8);
            if (local_5f8._M_dataplus._M_p == pcVar3) {
              std::__throw_invalid_argument("stod");
LAB_00107132:
              std::__throw_invalid_argument("stod");
LAB_0010713e:
              std::__throw_out_of_range("stod");
LAB_0010714a:
              std::__throw_out_of_range("stod");
              goto LAB_00107156;
            }
            if (*piVar7 != 0) {
              if (*piVar7 != 0x22) goto LAB_00106f0b;
              goto LAB_0010714a;
            }
            *piVar7 = iVar5;
LAB_00106f0b:
            local_5f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"x0:1","");
            pmVar8 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)__return_storage_ptr__,&local_5f8);
            *pmVar8 = dVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar3 = local_5d8;
            iVar5 = *piVar7;
            *piVar7 = 0;
            dVar2 = strtod(local_5d8,(char **)&local_5f8);
            if (local_5f8._M_dataplus._M_p == pcVar3) goto LAB_00107132;
            if (*piVar7 == 0) {
              *piVar7 = iVar5;
            }
            else if (*piVar7 == 0x22) goto LAB_0010713e;
            local_5f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"x0:2","");
            pmVar8 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)__return_storage_ptr__,&local_5f8);
            *pmVar8 = dVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_5d8 != &local_5c8) {
            operator_delete(local_5d8,CONCAT71(uStack_5c7,local_5c8) + 1);
          }
          if (local_5b8 != &local_5a8) {
            operator_delete(local_5b8,CONCAT71(uStack_5a7,local_5a8) + 1);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_538);
          std::ios_base::~ios_base(local_4c0);
        }
        else {
          piVar7 = __errno_location();
          iVar5 = *piVar7;
          *piVar7 = 0;
          dVar2 = strtod(pcVar3,local_538);
          if (local_538[0] == pcVar3) {
LAB_00107156:
            std::__throw_invalid_argument("stod");
LAB_00107162:
            uVar9 = std::__throw_out_of_range("stod");
            if (local_598 != &local_588) {
              operator_delete(local_598,CONCAT71(uStack_587,local_588) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p,
                              CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                                       local_558.field_2._M_local_buf[0]) + 1);
            }
            if (local_578 != &local_568) {
              operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
            }
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&__return_storage_ptr__->_M_h);
            _Unwind_Resume(uVar9);
          }
          if (*piVar7 == 0) {
            *piVar7 = iVar5;
          }
          else if (*piVar7 == 0x22) goto LAB_00107162;
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)__return_storage_ptr__,&local_558);
          *pmVar8 = dVar2;
        }
      }
      std::__cxx11::istringstream::~istringstream(local_3b8);
      std::ios_base::~ios_base(local_340);
    }
  }
  std::ifstream::~ifstream(local_238);
  if (local_598 != &local_588) {
    operator_delete(local_598,CONCAT71(uStack_587,local_588) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,
                    CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                             local_558.field_2._M_local_buf[0]) + 1);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<string, double> utils::cfg_parsing(string cfg_filename){
    std::unordered_map<string, double> param_map;
    string line;
    string key;
    string value;
    std::ifstream filestream(cfg_filename);
    if (filestream.is_open()) {
        while (std::getline(filestream, line)) {
            std::replace(line.begin(), line.end(), '=', ' ');
            std::istringstream linestream(line);
            while (linestream >> key >> value){
                if (key == "x0"){
                    std::replace(value.begin(), value.end(), ',', ' ');
                    std::istringstream valuestream(value);
                    string x_value1, x_value2;
                    while (valuestream >> x_value1 >> x_value2){
                        param_map["x0:1"]=stod(x_value1);
                        param_map["x0:2"]=stod(x_value2);
                    }
                }
                else
                    param_map[key]=stod(value);    
    
            } 
                
            
        }
    }
    return param_map;
}